

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O2

void __thiscall duckdb::ValidityMask::Write(ValidityMask *this,WriteStream *writer,idx_t count)

{
  TemplatedValidityMask<unsigned_long> *this_00;
  bool bVar1;
  idx_t iVar2;
  _func_int **pp_Var3;
  byte bVar4;
  ulong uVar5;
  undefined4 *puVar6;
  ulong val;
  ulong uVar7;
  idx_t i;
  ulong uVar8;
  undefined8 uStack_60;
  undefined2 local_50;
  char local_4e [2];
  undefined4 local_4c;
  TemplatedValidityMask<unsigned_long> *local_48;
  WriteStream *local_40;
  uint local_34;
  
  iVar2 = TemplatedValidityMask<unsigned_long>::CountValid
                    (&this->super_TemplatedValidityMask<unsigned_long>,count);
  val = count - iVar2;
  uVar8 = count + 0x3f >> 3 & 0xfffffffffffffff8;
  bVar4 = 2 - (count < 0xffff);
  uVar7 = (iVar2 << (bVar4 & 0x3f)) + 4;
  uVar5 = (val << (bVar4 & 0x3f)) + 4;
  if (uVar5 < uVar8 || uVar7 < uVar8) {
    local_4e[0] = '\x02' - (uVar7 < uVar5);
    local_48 = &this->super_TemplatedValidityMask<unsigned_long>;
    (**writer->_vptr_WriteStream)(writer,local_4e,1);
    if (iVar2 < val) {
      val = iVar2;
    }
    local_34 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
    local_40 = writer;
    (**writer->_vptr_WriteStream)(writer,&local_34,4);
    this_00 = local_48;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,iVar2);
      if (bVar1 == uVar7 < uVar5) {
        if (count < 0xffff) {
          local_50 = (undefined2)iVar2;
          pp_Var3 = local_40->_vptr_WriteStream;
          puVar6 = (undefined4 *)&local_50;
          uStack_60 = 2;
        }
        else {
          local_4c = (undefined4)iVar2;
          pp_Var3 = local_40->_vptr_WriteStream;
          puVar6 = &local_4c;
          uStack_60 = 4;
        }
        (**pp_Var3)(local_40,puVar6,uStack_60);
      }
    }
  }
  else {
    local_4e[1] = 0;
    (**writer->_vptr_WriteStream)(writer,local_4e + 1,1);
    (**writer->_vptr_WriteStream)
              (writer,(this->super_TemplatedValidityMask<unsigned_long>).validity_mask,uVar8);
  }
  return;
}

Assistant:

void ValidityMask::Write(WriteStream &writer, idx_t count) {
	auto valid_values = CountValid(count);
	auto invalid_values = count - valid_values;
	auto bitmask_bytes = ValidityMask::ValidityMaskSize(count);
	auto need_u32 = count >= NumericLimits<uint16_t>::Maximum();
	auto bytes_per_value = need_u32 ? sizeof(uint32_t) : sizeof(uint16_t);
	auto valid_value_size = bytes_per_value * valid_values + sizeof(uint32_t);
	auto invalid_value_size = bytes_per_value * invalid_values + sizeof(uint32_t);
	if (valid_value_size < bitmask_bytes || invalid_value_size < bitmask_bytes) {
		auto serialize_valid = valid_value_size < invalid_value_size;
		// serialize (in)valid value indexes as [COUNT][V0][V1][...][VN]
		auto flag = serialize_valid ? ValiditySerialization::VALID_VALUES : ValiditySerialization::INVALID_VALUES;
		writer.Write(flag);
		writer.Write<uint32_t>(NumericCast<uint32_t>(MinValue(valid_values, invalid_values)));
		for (idx_t i = 0; i < count; i++) {
			if (RowIsValid(i) == serialize_valid) {
				if (need_u32) {
					writer.Write<uint32_t>(UnsafeNumericCast<uint32_t>(i));
				} else {
					writer.Write<uint16_t>(UnsafeNumericCast<uint16_t>(i));
				}
			}
		}
	} else {
		// serialize the entire bitmask
		writer.Write(ValiditySerialization::BITMASK);
		writer.WriteData(const_data_ptr_cast(GetData()), bitmask_bytes);
	}
}